

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O1

void __thiscall tree::Tree::changeRoot(Tree *this,string *root)

{
  list<int,_std::allocator<int>_> *plVar1;
  pointer *pppFVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  iterator iVar5;
  pointer ppFVar6;
  long lVar7;
  FileItem *this_00;
  long lVar8;
  _List_node_base *p_Var9;
  vector<tree::FileItem_*,_std::allocator<tree::FileItem_*>_> *__range1;
  pointer ppFVar10;
  ulong uVar11;
  int e;
  ulong uVar12;
  vector<tree::FileItem_*,_std::allocator<tree::FileItem_*>_> child_fileitem;
  path dir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ret;
  string line;
  FileItem *fileitem;
  FileItem *item;
  vector<tree::FileItem_*,_std::allocator<tree::FileItem_*>_> local_118;
  long *local_f8;
  error_category *local_f0;
  long local_e8 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  long local_b8;
  string local_b0;
  FileItem *local_90;
  Path local_88;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  lVar7 = std::chrono::_V2::system_clock::now();
  local_f8 = local_e8;
  pcVar4 = (root->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,pcVar4,pcVar4 + root->_M_string_length);
  boost::filesystem::detail::status((path *)&local_b0,(error_code *)&local_f8);
  if (1 < (uint)local_b0._M_dataplus._M_p) {
    plVar1 = &(this->cfg).columns;
    for (p_Var9 = (this->cfg).columns.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                  super__List_node_base._M_next;
        (p_Var9 != (_List_node_base *)plVar1 && (*(int *)&p_Var9[1]._M_next != 2));
        p_Var9 = p_Var9->_M_next) {
    }
    if (p_Var9 != (_List_node_base *)plVar1) {
      pcVar4 = (root->_M_dataplus)._M_p;
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,pcVar4,pcVar4 + root->_M_string_length);
      FileItem::update_gmap(&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
    std::__cxx11::list<int,_std::allocator<int>_>::clear(&this->m_targets);
    uVar12 = (long)(this->m_fileitem).
                   super__Vector_base<tree::FileItem_*,_std::allocator<tree::FileItem_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->m_fileitem).
                   super__Vector_base<tree::FileItem_*,_std::allocator<tree::FileItem_*>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    e = (int)uVar12;
    erase_entrylist(this,0,e);
    this_00 = (FileItem *)operator_new(0x58);
    paVar3 = &local_88.m_pathname.field_2;
    local_88.m_pathname._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,local_f8,(long)&local_f0->_vptr_error_category + (long)local_f8);
    FileItem::FileItem(this_00,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88.m_pathname._M_dataplus._M_p != paVar3) {
      operator_delete(local_88.m_pathname._M_dataplus._M_p,
                      local_88.m_pathname.field_2._M_allocated_capacity + 1);
    }
    this_00->level = -1;
    this_00->opened_tree = true;
    iVar5._M_current =
         (this->m_fileitem).super__Vector_base<tree::FileItem_*,_std::allocator<tree::FileItem_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_90 = this_00;
    if (iVar5._M_current ==
        (this->m_fileitem).super__Vector_base<tree::FileItem_*,_std::allocator<tree::FileItem_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<tree::FileItem*,std::allocator<tree::FileItem*>>::
      _M_realloc_insert<tree::FileItem*const&>
                ((vector<tree::FileItem*,std::allocator<tree::FileItem*>> *)&this->m_fileitem,iVar5,
                 &local_90);
    }
    else {
      *iVar5._M_current = this_00;
      pppFVar2 = &(this->m_fileitem).
                  super__Vector_base<tree::FileItem_*,_std::allocator<tree::FileItem_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppFVar2 = *pppFVar2 + 1;
    }
    insert_rootcell(this,0);
    local_d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    makeline_abi_cxx11_(&local_b0,this,0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_d8,&local_b0);
    local_118.super__Vector_base<tree::FileItem_*,_std::allocator<tree::FileItem_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_118.super__Vector_base<tree::FileItem_*,_std::allocator<tree::FileItem_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_118.super__Vector_base<tree::FileItem_*,_std::allocator<tree::FileItem_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b8 = lVar7;
    entryInfoListRecursively
              (this,*(this->m_fileitem).
                     super__Vector_base<tree::FileItem_*,_std::allocator<tree::FileItem_*>_>._M_impl
                     .super__Vector_impl_data._M_start,&local_118);
    ppFVar6 = local_118.super__Vector_base<tree::FileItem_*,_std::allocator<tree::FileItem_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (local_118.super__Vector_base<tree::FileItem_*,_std::allocator<tree::FileItem_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_118.super__Vector_base<tree::FileItem_*,_std::allocator<tree::FileItem_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      ppFVar10 = local_118.super__Vector_base<tree::FileItem_*,_std::allocator<tree::FileItem_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      do {
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)*ppFVar10;
        iVar5._M_current =
             (this->m_fileitem).
             super__Vector_base<tree::FileItem_*,_std::allocator<tree::FileItem_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (this->m_fileitem).
            super__Vector_base<tree::FileItem_*,_std::allocator<tree::FileItem_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<tree::FileItem*,std::allocator<tree::FileItem*>>::
          _M_realloc_insert<tree::FileItem*const&>
                    ((vector<tree::FileItem*,std::allocator<tree::FileItem*>> *)&this->m_fileitem,
                     iVar5,(FileItem **)&local_48);
        }
        else {
          *iVar5._M_current =
               (FileItem *)
               local_48.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          pppFVar2 = &(this->m_fileitem).
                      super__Vector_base<tree::FileItem_*,_std::allocator<tree::FileItem_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          *pppFVar2 = *pppFVar2 + 1;
        }
        ppFVar10 = ppFVar10 + 1;
      } while (ppFVar10 != ppFVar6);
    }
    insert_entrylist(this,&local_118,1,&local_d8);
    lVar7 = local_b8;
    uVar11 = (long)(this->m_fileitem).
                   super__Vector_base<tree::FileItem_*,_std::allocator<tree::FileItem_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->m_fileitem).
                   super__Vector_base<tree::FileItem_*,_std::allocator<tree::FileItem_*>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    if (uVar11 < uVar12) {
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      buf_set_lines(this,(int)uVar11,e,true,&local_48);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
    }
    buf_set_lines(this,0,-1,true,&local_d8);
    hline(this,0,(int)((ulong)((long)(this->m_fileitem).
                                     super__Vector_base<tree::FileItem_*,_std::allocator<tree::FileItem_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->m_fileitem).
                                    super__Vector_base<tree::FileItem_*,_std::allocator<tree::FileItem_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3));
    lVar8 = std::chrono::_V2::system_clock::now();
    printf("change_root Elapsed time:%.9f secs.\n",SUB84((double)(lVar8 - lVar7) / 1000000000.0,0));
    if (local_118.super__Vector_base<tree::FileItem_*,_std::allocator<tree::FileItem_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_118.
                      super__Vector_base<tree::FileItem_*,_std::allocator<tree::FileItem_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_118.
                            super__Vector_base<tree::FileItem_*,_std::allocator<tree::FileItem_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_118.
                            super__Vector_base<tree::FileItem_*,_std::allocator<tree::FileItem_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_b0._M_dataplus._M_p._4_4_,(uint)local_b0._M_dataplus._M_p) !=
        &local_b0.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_b0._M_dataplus._M_p._4_4_,(uint)local_b0._M_dataplus._M_p),
                      local_b0.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_d8);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8,local_e8[0] + 1);
  }
  return;
}

Assistant:

void Tree::changeRoot(const string &root)
{
#ifndef NDEBUG
    auto start_change_root = system_clock::now();
#endif
    // TODO: cursor history
    path dir(root);
    if (!exists(dir)) {
        return;
    }

    // TODO broken when hold on redraw 10s
    auto i = find(cfg.columns.begin(), cfg.columns.end(), GIT);
    if (i != cfg.columns.end()) {
        FileItem::update_gmap(root);
    }
    m_targets.clear();
    const auto old_size = m_fileitem.size();
    erase_entrylist(0, old_size);

    FileItem *fileitem = new FileItem(dir);
    fileitem->level = -1;
    fileitem->opened_tree = true;
    m_fileitem.push_back(fileitem);

    insert_rootcell(0);
    // FIXME: when icon not available
    // col_map[ICON][0].text = "";

    vector<string> ret;
    string line = makeline(0);
    ret.push_back(line);

    vector<FileItem *> child_fileitem;
    entryInfoListRecursively(*m_fileitem[0], child_fileitem);
    for (auto item : child_fileitem) {
        m_fileitem.push_back(item);
    }

    insert_entrylist(child_fileitem, 1, ret);

    // NOTE: The cursor will jump when replacing text with unequal lines
    const auto new_size = m_fileitem.size();
    if (new_size < old_size) {
        buf_set_lines(new_size, old_size, true, {});
    }
    buf_set_lines(0, -1, true, ret);

    hline(0, m_fileitem.size());
#ifndef NDEBUG
    duration<double> time_change_root = system_clock::now() - start_change_root;
    printf("change_root Elapsed time:%.9f secs.\n", time_change_root.count());
#endif
}